

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varinfo.c
# Opt level: O0

int varinfo_set_mode(varinfo *info,char *mode)

{
  int iVar1;
  int local_24;
  int modeset;
  int data;
  char *mode_local;
  varinfo *info_local;
  
  _modeset = mode;
  mode_local = (char *)info;
  iVar1 = symtab_get_t(info->data->symtab,mode,3,&local_24);
  if (iVar1 == -1) {
    fprintf(_stderr,"no mode %s\n",_modeset);
    info_local._4_4_ = -1;
  }
  else {
    iVar1 = *(int *)(*(long *)(*(long *)mode_local + 0x38) + (long)local_24 * 0x30 + 0x28);
    if ((*(int *)(*(long *)(mode_local + 0x18) + (long)iVar1 * 4) == -1) ||
       (*(int *)(*(long *)(mode_local + 0x18) + (long)iVar1 * 4) == local_24)) {
      *(int *)(*(long *)(mode_local + 0x18) + (long)iVar1 * 4) = local_24;
      info_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"a mode from modeset %s has already been selected\n",
              *(undefined8 *)(*(long *)(*(long *)mode_local + 0x48) + (long)iVar1 * 0x18));
      info_local._4_4_ = -1;
    }
  }
  return info_local._4_4_;
}

Assistant:

int varinfo_set_mode(struct varinfo *info, const char *mode) {
	int data;
	if (symtab_get_t(info->data->symtab, mode, VARDATA_ST_MODE, &data) == -1) {
		fprintf(stderr, "no mode %s\n", mode);
		return -1;
	}
	int modeset = info->data->modes[data].modeset;
	if (info->modes[modeset] != -1 && info->modes[modeset] != data) {
		fprintf(stderr, "a mode from modeset %s has already been selected\n", info->data->modesets[modeset].name);
		return -1;
	}
	info->modes[modeset] = data;
	/* XXX: validate mode */
	return 0;
}